

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::on_proxy_name_lookup
          (torrent *this,error_code *e,
          vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *addrs,
          iterator web,int port)

{
  ip_filter *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  int extraout_EDX;
  int extraout_EDX_00;
  undefined4 in_register_00000084;
  string_view url;
  int port_local;
  endpoint a;
  undefined1 local_158 [24];
  int local_140;
  undefined4 uStack_13c;
  _Any_data local_c8;
  element_type *local_b8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  error_code ec;
  string protocol;
  string hostname;
  shared_ptr<libtorrent::aux::torrent> self;
  
  port_local = port;
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,"completed resolve proxy hostname for: %s",web._M_node[1]._M_next);
  if ((e->failed_ == true) &&
     (iVar6 = (*(this->super_request_callback)._vptr_request_callback[6])(this), (char)iVar6 != '\0'
     )) {
    (*e->cat_->_vptr_error_category[4])(local_158,e->cat_,(ulong)(uint)e->val_);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"proxy name lookup error: %s",local_158._0_8_);
    ::std::__cxx11::string::~string((string *)local_158);
  }
  *(undefined1 *)((long)&web._M_node[0xb]._M_next + 1) = 0;
  if (*(char *)((long)&web._M_node[0xb]._M_next + 2) == '\x01') {
    (*(this->super_request_callback)._vptr_request_callback[7])(this,"removed web seed");
    remove_web_seed_iter(this,web);
    return;
  }
  if (((this->super_torrent_hot_members).field_0x4b & 4) != 0) {
    return;
  }
  iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x11])();
  if ((char)iVar6 != '\0') {
    return;
  }
  if ((e->failed_ != false) ||
     ((addrs->
      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (addrs->
      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>).
      _M_impl.super__Vector_impl_data._M_finish)) {
    iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    if ((*(uint *)(CONCAT44(extraout_var_02,iVar6) + 0x68) & 3) != 0) {
      iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_158);
      alert_manager::
      emplace_alert<libtorrent::url_seed_alert,libtorrent::torrent_handle,std::__cxx11::string&,boost::system::error_code_const&>
                ((alert_manager *)CONCAT44(extraout_var_03,iVar6),(torrent_handle *)local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (web._M_node + 1),e);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
    }
    *(undefined1 *)((long)&web._M_node[0xb]._M_next + 6) = 1;
    return;
  }
  iVar6 = num_peers(this);
  if ((int)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x21) &
           0xffffff) <= iVar6) {
    return;
  }
  iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x1e])();
  iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  iVar7 = session_settings::get_int((session_settings *)CONCAT44(extraout_var,iVar7),0x4055);
  if (iVar7 <= iVar6) {
    return;
  }
  boost::asio::ip::detail::endpoint::endpoint
            (&a.impl_,(addrs->
                      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                      )._M_impl.super__Vector_impl_data._M_start,(unsigned_short)port_local);
  hostname._M_dataplus._M_p = (pointer)&hostname.field_2;
  hostname._M_string_length = 0;
  ec.val_ = 0;
  hostname.field_2._M_local_buf[0] = '\0';
  ec.failed_ = false;
  protocol._M_dataplus._M_p = (pointer)&protocol.field_2;
  protocol._M_string_length = 0;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  protocol.field_2._M_local_buf[0] = '\0';
  url._M_str = (char *)&ec;
  url._M_len = (size_t)web._M_node[1]._M_next;
  parse_url_components_abi_cxx11_
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_158,(aux *)web._M_node[1]._M_prev,url,
             (error_code *)CONCAT44(in_register_00000084,port));
  self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&::std::ignore;
  self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&port_local;
  ::std::
  _Tuple_impl<0ul,std::__cxx11::string&,std::_Swallow_assign_const&,std::__cxx11::string&,int&,std::_Swallow_assign_const&>
  ::
  _M_assign<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
            ((_Tuple_impl<0ul,std::__cxx11::string&,std::_Swallow_assign_const&,std::__cxx11::string&,int&,std::_Swallow_assign_const&>
              *)&self,(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_158);
  ::std::
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_158);
  iVar6 = extraout_EDX;
  if (port_local == -1) {
    bVar5 = ::std::operator==(&protocol,"http");
    port_local = 0x1bb;
    iVar6 = extraout_EDX_00;
    if (bVar5) {
      port_local = 0x50;
    }
  }
  if (ec.failed_ == true) {
    iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    if ((*(uint *)(CONCAT44(extraout_var_00,iVar6) + 0x68) & 3) != 0) {
      iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_158);
      alert_manager::
      emplace_alert<libtorrent::url_seed_alert,libtorrent::torrent_handle,std::__cxx11::string&,boost::system::error_code&>
                ((alert_manager *)CONCAT44(extraout_var_01,iVar6),(torrent_handle *)local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (web._M_node + 1),&ec);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
    }
    remove_web_seed_iter(this,web);
  }
  else {
    this_00 = (this->m_ip_filter).
              super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00 != (ip_filter *)0x0) {
      if (a.impl_.data_.base.sa_family != 2) {
        local_158[8] = a.impl_.data_._8_1_;
        local_158[9] = a.impl_.data_._9_1_;
        local_158[10] = a.impl_.data_._10_1_;
        local_158[0xb] = a.impl_.data_._11_1_;
        local_158[0xc] = a.impl_.data_._12_1_;
        local_158[0xd] = a.impl_.data_._13_1_;
        local_158[0xe] = a.impl_.data_._14_1_;
        local_158[0xf] = a.impl_.data_._15_1_;
        local_158._16_8_ = a.impl_.data_._16_8_;
        _local_140 = ZEXT48(a.impl_.data_.v6.sin6_scope_id);
        a.impl_.data_.v6.sin6_flowinfo = 0;
      }
      else {
        local_158._8_8_ =
             (_Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
              )0x0;
        local_158._16_8_ = (_List_node_base *)0x0;
        _local_140 = 0;
      }
      local_158._1_3_ = 0;
      local_158[0] = a.impl_.data_.base.sa_family != 2;
      local_158._4_4_ = a.impl_.data_.v6.sin6_flowinfo;
      uVar8 = ip_filter::access(this_00,local_158,iVar6);
      if ((uVar8 & 1) != 0) {
        iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        if ((*(uint *)(CONCAT44(extraout_var_05,iVar6) + 0x68) >> 8 & 1) != 0) {
          iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[5])();
          get_handle((torrent *)local_158);
          self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               ((ulong)self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr & 0xffffffff00000000);
          alert_manager::
          emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::peer_blocked_alert::reason_t>
                    ((alert_manager *)CONCAT44(extraout_var_06,iVar6),(torrent_handle *)local_158,&a
                     ,(reason_t *)&self);
          ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
        }
        goto LAB_002e08a3;
      }
    }
    ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::torrent,void>
              ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&self,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
    *(undefined1 *)((long)&web._M_node[0xb]._M_next + 1) = 1;
    iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [8])();
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_158,
               &self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
    local_140 = port_local;
    local_c8._M_unused._M_object = (void *)0x0;
    local_c8._8_4_ = 0;
    local_c8._12_4_ = 0;
    local_b8 = (element_type *)0x0;
    _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_158._16_8_ = web._M_node;
    local_c8._M_unused._M_object = operator_new(0x20);
    uVar1 = local_158._0_4_;
    uVar2 = local_158._4_4_;
    uVar3 = local_158._8_4_;
    uVar4 = local_158._12_4_;
    local_158._8_8_ =
         (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
          )0x0;
    local_158._0_8_ = (pointer)0x0;
    *(undefined4 *)local_c8._M_unused._0_8_ = uVar1;
    *(undefined4 *)((long)local_c8._M_unused._0_8_ + 4) = uVar2;
    *(undefined4 *)((long)local_c8._M_unused._0_8_ + 8) = uVar3;
    *(undefined4 *)((long)local_c8._M_unused._0_8_ + 0xc) = uVar4;
    *(int *)((long)local_c8._M_unused._0_8_ + 0x18) = local_140;
    *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x10) = local_158._16_8_;
    _Stack_b0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ::std::
         _Function_handler<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:6603:6)>
         ::_M_invoke;
    local_b8 = (element_type *)
               ::std::
               _Function_handler<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:6603:6)>
               ::_M_manager;
    (*(code *)**(undefined8 **)CONCAT44(extraout_var_04,iVar6))
              ((undefined8 *)CONCAT44(extraout_var_04,iVar6),&hostname,2);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_c8);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
LAB_002e08a3:
  ::std::__cxx11::string::~string((string *)&protocol);
  ::std::__cxx11::string::~string((string *)&hostname);
  return;
}

Assistant:

void torrent::on_proxy_name_lookup(error_code const& e
		, std::vector<address> const& addrs
		, std::list<web_seed_t>::iterator web, int port) try
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		TORRENT_ASSERT(web->resolving);
#ifndef TORRENT_DISABLE_LOGGING
		debug_log("completed resolve proxy hostname for: %s", web->url.c_str());
		if (e && should_log())
			debug_log("proxy name lookup error: %s", e.message().c_str());
#endif
		web->resolving = false;

		if (web->removed)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("removed web seed");
#endif
			remove_web_seed_iter(web);
			return;
		}

		if (m_abort) return;
		if (m_ses.is_aborted()) return;

		if (e || addrs.empty())
		{
			if (m_ses.alerts().should_post<url_seed_alert>())
			{
				m_ses.alerts().emplace_alert<url_seed_alert>(get_handle()
					, web->url, e);
			}

			// the name lookup failed for the http host. Don't try
			// this host again
			web->disabled = true;
			return;
		}

		if (num_peers() >= int(m_max_connections)
			|| m_ses.num_connections() >= settings().get_int(settings_pack::connections_limit))
			return;

		tcp::endpoint a(addrs[0], std::uint16_t(port));

		std::string hostname;
		error_code ec;
		std::string protocol;
		std::tie(protocol, std::ignore, hostname, port, std::ignore)
			= parse_url_components(web->url, ec);
		if (port == -1) port = protocol == "http" ? 80 : 443;

		if (ec)
		{
			if (m_ses.alerts().should_post<url_seed_alert>())
			{
				m_ses.alerts().emplace_alert<url_seed_alert>(get_handle()
					, web->url, ec);
			}
			remove_web_seed_iter(web);
			return;
		}

		if (m_ip_filter && m_ip_filter->access(a.address()) & ip_filter::blocked)
		{
			if (m_ses.alerts().should_post<peer_blocked_alert>())
				m_ses.alerts().emplace_alert<peer_blocked_alert>(get_handle()
					, a, peer_blocked_alert::ip_filter);
			return;
		}

		auto self = shared_from_this();
		web->resolving = true;
		m_ses.get_resolver().async_resolve(hostname, aux::resolver_interface::abort_on_shutdown
			, [self, web, port](error_code const& err, std::vector<address> const& addr)
			{
				self->wrap(&torrent::on_name_lookup, err, addr, port, web);
			});
	}
	catch (...) { handle_exception(); }